

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O0

void StoreSymbol(BlockEncoder *self,size_t symbol,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  size_t sVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  uint local_1cc;
  uint local_1c8;
  uint local_1c4;
  size_t ix;
  uint8_t block_type;
  uint32_t block_len;
  size_t block_ix;
  uint8_t *storage_local;
  size_t *storage_ix_local;
  size_t symbol_local;
  BlockEncoder *self_local;
  uint64_t v_3;
  uint8_t *p_3;
  undefined1 local_148 [4];
  undefined1 local_144 [4];
  uint32_t len_extra;
  uint32_t len_nextra;
  size_t lencode;
  size_t typecode;
  size_t *local_128;
  undefined4 local_11c;
  byte local_115;
  uint local_114;
  BlockSplitCode *local_110;
  ulong local_108;
  uint64_t v_2;
  uint8_t *p_2;
  size_t *local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  uint64_t v_1;
  uint8_t *p_1;
  size_t *local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  uint64_t v;
  uint8_t *p;
  size_t *local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong *local_70;
  ulong local_68;
  ulong *local_60;
  ulong local_58;
  ulong *local_50;
  ulong local_48;
  size_t type_code;
  BlockSplitCode *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  uint32_t *local_20;
  uint local_14;
  uint local_10;
  uint local_c;
  uint32_t code;
  
  if (self->block_len_ == 0) {
    sVar4 = self->block_ix_ + 1;
    self->block_ix_ = sVar4;
    local_114 = self->block_lengths_[sVar4];
    local_115 = self->block_types_[sVar4];
    self->block_len_ = (ulong)local_114;
    self->entropy_ix_ = (ulong)local_115 * self->alphabet_size_;
    local_110 = &self->block_split_code_;
    local_11c = 0;
    if ((ulong)local_115 == (local_110->type_code_calculator).last_type + 1) {
      local_1c4 = 1;
    }
    else {
      if ((ulong)local_115 == (self->block_split_code_).type_code_calculator.second_last_type) {
        local_1c8 = 0;
      }
      else {
        local_1c8 = local_115 + 2;
      }
      local_1c4 = local_1c8;
    }
    lencode = (size_t)local_1c4;
    (self->block_split_code_).type_code_calculator.second_last_type =
         (local_110->type_code_calculator).last_type;
    (local_110->type_code_calculator).last_type = (ulong)local_115;
    bVar1 = (self->block_split_code_).type_depths[lencode];
    local_80 = (ulong)bVar1;
    uVar2 = (self->block_split_code_).type_bits[lencode];
    local_88 = (ulong)uVar2;
    v = (uint64_t)(storage + (*storage_ix >> 3));
    local_a8 = (ulong)(byte)*(ulong *)v;
    typecode = (size_t)storage;
    local_128 = storage_ix;
    p = storage;
    local_90 = storage_ix;
    local_48 = lencode;
    type_code._7_1_ = local_115;
    local_38 = local_110;
    if (uVar2 >> (bVar1 & 0x3f) != 0) {
      __assert_fail("(bits >> n_bits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                    ,0x36,
                    "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
    }
    if (0x38 < local_80) {
      __assert_fail("n_bits <= 56",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                    ,0x37,
                    "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
    }
    local_a8 = local_88 << ((byte)*storage_ix & 7) | local_a8;
    *(ulong *)v = local_a8;
    *storage_ix = local_80 + *storage_ix;
    local_20 = &len_extra;
    local_28 = local_144;
    local_30 = local_148;
    if (local_114 < 0xb1) {
      local_1cc = 0;
      if (0x28 < local_114) {
        local_1cc = 7;
      }
    }
    else {
      local_1cc = 0xe;
      if (0x2f0 < local_114) {
        local_1cc = 0x14;
      }
    }
    local_10 = local_1cc;
    while( true ) {
      bVar8 = false;
      if (local_10 < 0x19) {
        bVar8 = kBlockLengthPrefixCode[local_10 + 1].offset <= local_114;
      }
      if (!bVar8) break;
      local_10 = local_10 + 1;
    }
    uVar7 = (ulong)local_10;
    uVar3 = kBlockLengthPrefixCode[uVar7].nbits;
    uVar6 = local_114 - kBlockLengthPrefixCode[_len_extra].offset;
    bVar1 = (self->block_split_code_).length_depths[uVar7];
    local_b0 = (ulong)bVar1;
    uVar2 = (self->block_split_code_).length_bits[uVar7];
    local_b8 = (ulong)uVar2;
    v_1 = (uint64_t)(storage + (*storage_ix >> 3));
    local_d8 = (ulong)(byte)*(ulong *)v_1;
    p_1 = storage;
    local_c0 = storage_ix;
    local_78 = local_a8;
    local_70 = (ulong *)v;
    local_14 = local_114;
    local_c = local_114;
    if (uVar2 >> (bVar1 & 0x3f) != 0) {
      __assert_fail("(bits >> n_bits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                    ,0x36,
                    "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
    }
    if (0x38 < local_b0) {
      __assert_fail("n_bits <= 56",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                    ,0x37,
                    "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
    }
    local_d8 = local_b8 << ((byte)*storage_ix & 7) | local_d8;
    *(ulong *)v_1 = local_d8;
    *storage_ix = local_b0 + *storage_ix;
    local_e0 = (ulong)uVar3;
    local_e8 = (ulong)uVar6;
    v_2 = (uint64_t)(storage + (*storage_ix >> 3));
    local_108 = (ulong)(byte)*(ulong *)v_2;
    p_2 = storage;
    local_f0 = storage_ix;
    local_68 = local_d8;
    local_60 = (ulong *)v_1;
    if (uVar6 >> ((byte)uVar3 & 0x3f) != 0) {
      __assert_fail("(bits >> n_bits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                    ,0x36,
                    "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
    }
    if (0x38 < local_e0) {
      __assert_fail("n_bits <= 56",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                    ,0x37,
                    "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
    }
    local_108 = local_e8 << ((byte)*storage_ix & 7) | local_108;
    *(ulong *)v_2 = local_108;
    *storage_ix = local_e0 + *storage_ix;
    local_58 = local_108;
    local_50 = (ulong *)v_2;
  }
  self->block_len_ = self->block_len_ - 1;
  lVar5 = self->entropy_ix_ + symbol;
  bVar1 = self->depths_[lVar5];
  if (self->bits_[lVar5] >> (bVar1 & 0x3f) != 0) {
    __assert_fail("(bits >> n_bits) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                  ,0x36,
                  "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
  }
  if (0x38 < (ulong)bVar1) {
    __assert_fail("n_bits <= 56",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                  ,0x37,
                  "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
  }
  *(ulong *)(storage + (*storage_ix >> 3)) =
       (ulong)self->bits_[lVar5] << ((byte)*storage_ix & 7) |
       (ulong)(byte)*(ulong *)(storage + (*storage_ix >> 3));
  *storage_ix = (ulong)bVar1 + *storage_ix;
  return;
}

Assistant:

static void StoreSymbol(BlockEncoder* self, size_t symbol, size_t* storage_ix,
    uint8_t* storage) {
  if (self->block_len_ == 0) {
    size_t block_ix = ++self->block_ix_;
    uint32_t block_len = self->block_lengths_[block_ix];
    uint8_t block_type = self->block_types_[block_ix];
    self->block_len_ = block_len;
    self->entropy_ix_ = block_type * self->alphabet_size_;
    StoreBlockSwitch(&self->block_split_code_, block_len, block_type, 0,
        storage_ix, storage);
  }
  --self->block_len_;
  {
    size_t ix = self->entropy_ix_ + symbol;
    BrotliWriteBits(self->depths_[ix], self->bits_[ix], storage_ix, storage);
  }
}